

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O0

ssize_t __thiscall kj::TestRunner::write(TestRunner *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  void *__buf_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  FdOutputStream local_38;
  TestRunner *local_20;
  TestRunner *this_local;
  StringPtr text_local;
  
  this_local = (TestRunner *)CONCAT44(in_register_00000034,__fd);
  local_20 = this;
  text_local.content.ptr = (char *)__buf;
  FdOutputStream::FdOutputStream(&local_38,1);
  pcVar1 = StringPtr::begin((StringPtr *)&this_local);
  __buf_00 = (void *)StringPtr::size((StringPtr *)&this_local);
  FdOutputStream::write(&local_38,(int)pcVar1,__buf_00,__n);
  FdOutputStream::~FdOutputStream(&local_38);
  return extraout_RAX;
}

Assistant:

void write(StringPtr text) {
    FdOutputStream(STDOUT_FILENO).write(text.begin(), text.size());
  }